

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

ImVec2 ImTriangleClosestPoint(ImVec2 *a,ImVec2 *b,ImVec2 *c,ImVec2 *p)

{
  float fVar1;
  ImVec2 IVar2;
  float fVar3;
  float fVar4;
  ImVec2 IVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  fVar9 = p->x;
  fVar1 = p->y;
  IVar5 = *a;
  auVar6._8_8_ = 0;
  auVar6._0_4_ = IVar5.x;
  auVar6._4_4_ = IVar5.y;
  auVar11 = vmovshdup_avx(auVar6);
  IVar2 = *b;
  auVar12._8_8_ = 0;
  auVar12._0_4_ = IVar2.x;
  auVar12._4_4_ = IVar2.y;
  auVar14 = vsubps_avx(auVar12,auVar6);
  auVar10 = vmovshdup_avx(auVar14);
  fVar16 = auVar10._0_4_;
  fVar4 = auVar14._0_4_;
  fVar3 = (fVar9 - IVar5.x) * fVar4 + (fVar1 - auVar11._0_4_) * fVar16;
  if (0.0 <= fVar3) {
    fVar16 = fVar4 * fVar4 + fVar16 * fVar16;
    if (fVar3 <= fVar16) {
      auVar11._0_4_ = fVar4 * fVar3;
      auVar11._4_4_ = auVar14._4_4_ * fVar3;
      auVar11._8_4_ = auVar14._8_4_ * fVar3;
      auVar11._12_4_ = auVar14._12_4_ * fVar3;
      auVar14._4_4_ = fVar16;
      auVar14._0_4_ = fVar16;
      auVar14._8_4_ = fVar16;
      auVar14._12_4_ = fVar16;
      auVar11 = vdivps_avx(auVar11,auVar14);
      auVar10._0_4_ = IVar5.x + auVar11._0_4_;
      auVar10._4_4_ = IVar5.y + auVar11._4_4_;
      auVar10._8_4_ = auVar11._8_4_ + 0.0;
      auVar10._12_4_ = auVar11._12_4_ + 0.0;
    }
    else {
      auVar10._8_8_ = 0;
      auVar10._0_4_ = b->x;
      auVar10._4_4_ = b->y;
    }
  }
  else {
    auVar10._8_8_ = 0;
    auVar10._0_4_ = a->x;
    auVar10._4_4_ = a->y;
  }
  auVar11 = vmovshdup_avx(auVar12);
  IVar5 = *c;
  auVar15._8_8_ = 0;
  auVar15._0_4_ = IVar5.x;
  auVar15._4_4_ = IVar5.y;
  auVar12 = vsubps_avx(auVar15,auVar12);
  auVar14 = vmovshdup_avx(auVar12);
  fVar16 = auVar14._0_4_;
  fVar4 = auVar12._0_4_;
  fVar3 = (fVar1 - auVar11._0_4_) * fVar16 + (fVar9 - IVar2.x) * fVar4;
  if (0.0 <= fVar3) {
    fVar16 = fVar4 * fVar4 + fVar16 * fVar16;
    if (fVar3 <= fVar16) {
      auVar17._0_4_ = fVar4 * fVar3;
      auVar17._4_4_ = auVar12._4_4_ * fVar3;
      auVar17._8_4_ = auVar12._8_4_ * fVar3;
      auVar17._12_4_ = auVar12._12_4_ * fVar3;
      auVar19._4_4_ = fVar16;
      auVar19._0_4_ = fVar16;
      auVar19._8_4_ = fVar16;
      auVar19._12_4_ = fVar16;
      auVar11 = vdivps_avx(auVar17,auVar19);
      auVar13._0_4_ = IVar2.x + auVar11._0_4_;
      auVar13._4_4_ = IVar2.y + auVar11._4_4_;
      auVar13._8_4_ = auVar11._8_4_ + 0.0;
      auVar13._12_4_ = auVar11._12_4_ + 0.0;
    }
    else {
      auVar13._8_8_ = 0;
      auVar13._0_4_ = c->x;
      auVar13._4_4_ = c->y;
    }
  }
  else {
    auVar13._8_8_ = 0;
    auVar13._0_4_ = b->x;
    auVar13._4_4_ = b->y;
  }
  auVar11 = vmovshdup_avx(auVar15);
  auVar6 = vsubps_avx(auVar6,auVar15);
  auVar14 = vmovshdup_avx(auVar6);
  fVar16 = auVar14._0_4_;
  fVar4 = auVar6._0_4_;
  fVar3 = (fVar1 - auVar11._0_4_) * fVar16 + (fVar9 - IVar5.x) * fVar4;
  if (0.0 <= fVar3) {
    fVar16 = fVar4 * fVar4 + fVar16 * fVar16;
    if (fVar3 <= fVar16) {
      auVar7._0_4_ = fVar4 * fVar3;
      auVar7._4_4_ = auVar6._4_4_ * fVar3;
      auVar7._8_4_ = auVar6._8_4_ * fVar3;
      auVar7._12_4_ = auVar6._12_4_ * fVar3;
      auVar18._4_4_ = fVar16;
      auVar18._0_4_ = fVar16;
      auVar18._8_4_ = fVar16;
      auVar18._12_4_ = fVar16;
      auVar11 = vdivps_avx(auVar7,auVar18);
      auVar8._0_4_ = IVar5.x + auVar11._0_4_;
      auVar8._4_4_ = IVar5.y + auVar11._4_4_;
      auVar8._8_4_ = auVar11._8_4_ + 0.0;
      auVar8._12_4_ = auVar11._12_4_ + 0.0;
    }
    else {
      auVar8._8_8_ = 0;
      auVar8._0_4_ = a->x;
      auVar8._4_4_ = a->y;
    }
  }
  else {
    auVar8._8_8_ = 0;
    auVar8._0_4_ = c->x;
    auVar8._4_4_ = c->y;
  }
  IVar5 = auVar8._0_8_;
  fVar3 = fVar9 - auVar10._0_4_;
  auVar11 = vmovshdup_avx(auVar10);
  fVar4 = fVar1 - auVar11._0_4_;
  fVar3 = fVar3 * fVar3 + fVar4 * fVar4;
  fVar4 = fVar9 - auVar13._0_4_;
  auVar11 = vmovshdup_avx(auVar13);
  fVar16 = fVar1 - auVar11._0_4_;
  fVar4 = fVar4 * fVar4 + fVar16 * fVar16;
  fVar9 = fVar9 - auVar8._0_4_;
  auVar11 = vmovshdup_avx(auVar8);
  fVar1 = fVar1 - auVar11._0_4_;
  auVar11 = vminss_avx(ZEXT416((uint)fVar4),ZEXT416((uint)(fVar9 * fVar9 + fVar1 * fVar1)));
  auVar11 = vminss_avx(ZEXT416((uint)fVar3),auVar11);
  fVar9 = auVar11._0_4_;
  if ((fVar9 == fVar4) && (!NAN(fVar9) && !NAN(fVar4))) {
    IVar5 = auVar13._0_8_;
  }
  if ((fVar9 == fVar3) && (!NAN(fVar9) && !NAN(fVar3))) {
    IVar5 = auVar10._0_8_;
  }
  return IVar5;
}

Assistant:

static inline ImVec2 operator-(const ImVec2& lhs, const ImVec2& rhs)            { return ImVec2(lhs.x - rhs.x, lhs.y - rhs.y); }